

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O1

void init_dsmotion_compensation(search_site_config *cfg,int stride,int level)

{
  FULLPEL_MV FVar1;
  uint uVar2;
  search_site (*pasVar3) [17];
  bool bVar4;
  long lVar5;
  int iVar6;
  int radius;
  uint uVar7;
  long lVar8;
  undefined1 auVar9 [16];
  FULLPEL_MV local_58;
  ushort local_54;
  undefined2 uStack_52;
  ushort local_50;
  undefined2 local_4e;
  undefined1 local_4c [16];
  ushort local_3c;
  ushort local_3a;
  ushort local_38;
  ushort local_36;
  
  pasVar3 = cfg->site + 10;
  cfg->site[10][0].mv.row = 0;
  cfg->site[10][0].mv.col = 0;
  cfg->site[10][0].offset = 0;
  cfg->stride = stride;
  uVar7 = 0x400;
  if (0 < level) {
    uVar7 = 0x100;
  }
  lVar8 = 10;
  iVar6 = 0;
  do {
    local_58.row = 0;
    local_58.col = 0;
    local_50 = (ushort)uVar7;
    local_54 = -local_50;
    uStack_52 = 0;
    local_4e = 0;
    auVar9._8_4_ = (int)((ulong)local_54 << 0x10);
    auVar9._0_8_ = (ulong)local_54 << 0x10 | (ulong)local_50 << 0x30;
    auVar9._12_4_ = (int)(((ulong)local_50 << 0x30) >> 0x20);
    local_4c = pshufhw(auVar9,auVar9,0xf5);
    local_3c = local_54;
    local_3a = local_50;
    local_38 = local_50;
    local_36 = local_54;
    lVar5 = 0;
    do {
      FVar1 = (&local_58)[lVar5];
      (*pasVar3)[lVar5].mv = FVar1;
      (*pasVar3)[lVar5].offset = (int)(*pasVar3)[lVar5].mv.col + FVar1.row * stride;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 9);
    cfg->searches_per_step[lVar8] = 8;
    cfg->radius[lVar8] = uVar7;
    bVar4 = lVar8 < 9 || level == 0;
    lVar8 = lVar8 + -1;
    iVar6 = iVar6 + 1;
    pasVar3 = pasVar3 + -1;
    uVar2 = uVar7 >> bVar4;
    uVar7 = uVar7 >> bVar4;
  } while (uVar2 != 0);
  cfg->num_search_steps = iVar6;
  return;
}

Assistant:

static void init_dsmotion_compensation(search_site_config *cfg, int stride,
                                       int level) {
  int num_search_steps = 0;
  int stage_index = MAX_MVSEARCH_STEPS - 1;

  cfg->site[stage_index][0].mv.col = cfg->site[stage_index][0].mv.row = 0;
  cfg->site[stage_index][0].offset = 0;
  cfg->stride = stride;

  // Choose the initial step size depending on level.
  const int first_step = (level > 0) ? (MAX_FIRST_STEP / 4) : MAX_FIRST_STEP;

  for (int radius = first_step; radius > 0;) {
    int num_search_pts = 8;

    const FULLPEL_MV search_site_mvs[13] = {
      { 0, 0 },           { -radius, 0 },      { radius, 0 },
      { 0, -radius },     { 0, radius },       { -radius, -radius },
      { radius, radius }, { -radius, radius }, { radius, -radius },
    };

    int i;
    for (i = 0; i <= num_search_pts; ++i) {
      search_site *const site = &cfg->site[stage_index][i];
      site->mv = search_site_mvs[i];
      site->offset = get_offset_from_fullmv(&site->mv, stride);
    }
    cfg->searches_per_step[stage_index] = num_search_pts;
    cfg->radius[stage_index] = radius;
    // Update the search radius based on level.
    if (!level || ((stage_index < 9) && level)) radius /= 2;
    --stage_index;
    ++num_search_steps;
  }
  cfg->num_search_steps = num_search_steps;
}